

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void fadst16x16_new_avx2(__m256i *input,__m256i *output,int8_t cos_bit)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  __m256i _r_00;
  __m256i _r_01;
  __m256i _r_02;
  __m256i _r_03;
  __m256i _r_04;
  __m256i _r_05;
  __m256i _r_06;
  __m256i _r_07;
  __m256i _r_08;
  __m256i _r_09;
  __m256i _r_10;
  __m256i _r_11;
  __m256i _r_12;
  __m256i _r_13;
  __m256i _r_14;
  __m256i _r_15;
  __m256i _r_16;
  __m256i _r_17;
  __m256i _r_18;
  __m256i _r_19;
  __m256i w1;
  __m256i w1_00;
  __m256i w1_01;
  __m256i w1_02;
  __m256i w1_03;
  __m256i w1_04;
  __m256i w1_05;
  __m256i w1_06;
  __m256i w1_07;
  __m256i w1_08;
  __m256i w1_09;
  __m256i w1_10;
  __m256i w1_11;
  __m256i w1_12;
  __m256i w1_13;
  __m256i w1_14;
  __m256i w1_15;
  __m256i w1_16;
  __m256i w1_17;
  __m256i w1_18;
  __m256i w0;
  __m256i w0_00;
  __m256i w0_01;
  __m256i w0_02;
  __m256i w0_03;
  __m256i w0_04;
  __m256i w0_05;
  __m256i w0_06;
  __m256i w0_07;
  __m256i w0_08;
  __m256i w0_09;
  __m256i w0_10;
  __m256i w0_11;
  __m256i w0_12;
  __m256i w0_13;
  __m256i w0_14;
  __m256i w0_15;
  __m256i w0_16;
  __m256i w0_17;
  __m256i w0_18;
  uint uVar37;
  char in_DL;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined1 auVar38 [16];
  __m256i *in1;
  longlong lVar39;
  undefined1 auVar40 [16];
  __m256i x1 [16];
  __m256i cospi_p06_m58;
  __m256i cospi_p58_p06;
  __m256i cospi_p14_m50;
  __m256i cospi_p50_p14;
  __m256i cospi_p22_m42;
  __m256i cospi_p42_p22;
  __m256i cospi_p30_m34;
  __m256i cospi_p34_p30;
  __m256i cospi_p38_m26;
  __m256i cospi_p26_p38;
  __m256i cospi_p46_m18;
  __m256i cospi_p18_p46;
  __m256i cospi_p54_m10;
  __m256i cospi_p10_p54;
  __m256i cospi_p62_m02;
  __m256i cospi_p02_p62;
  __m256i cospi_m24_p40;
  __m256i cospi_m56_p08;
  __m256i cospi_p24_m40;
  __m256i cospi_p40_p24;
  __m256i cospi_p56_m08;
  __m256i cospi_p08_p56;
  __m256i cospi_m48_p16;
  __m256i cospi_p48_m16;
  __m256i cospi_p16_p48;
  __m256i cospi_p32_m32;
  __m256i cospi_p32_p32;
  __m256i _r;
  __m256i __zero;
  int32_t *cospi;
  undefined4 in_stack_fffffffffffff790;
  undefined8 uVar41;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  __m256i *in1_00;
  __m256i *in0;
  undefined8 uStack_828;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined4 uStack_6b0;
  int32_t cos_bit_00;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  longlong lVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  
  cospi_arr((int)in_DL);
  uVar37 = 1 << (in_DL - 1U & 0x1f);
  auVar48 = vpinsrd_avx(ZEXT416(uVar37),uVar37,1);
  auVar48 = vpinsrd_avx(auVar48,uVar37,2);
  auVar48 = vpinsrd_avx(auVar48,uVar37,3);
  auVar46 = vpinsrd_avx(ZEXT416(uVar37),uVar37,1);
  auVar46 = vpinsrd_avx(auVar46,uVar37,2);
  auVar46 = vpinsrd_avx(auVar46,uVar37,3);
  auVar38 = ZEXT116(0) * auVar48 + ZEXT116(1) * auVar46;
  auVar40 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar48;
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  lVar39 = auVar40._0_8_;
  auVar48 = auVar38;
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  auVar46 = auVar38;
  auVar47 = auVar40;
  pair_set_w16_epi16((int16_t)((uint)in_stack_fffffffffffff790 >> 0x10),
                     (int16_t)in_stack_fffffffffffff790);
  in1 = auVar38._8_8_;
  uVar9 = *in_RDI;
  uVar10 = in_RDI[1];
  uVar41 = in_RDI[2];
  uVar11 = in_RDI[3];
  auVar1 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])(in_RDI + 0x3c));
  auVar2 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])(in_RDI + 0x1c));
  uVar12 = in_RDI[0x20];
  uVar13 = in_RDI[0x21];
  uVar14 = in_RDI[0x22];
  uVar15 = in_RDI[0x23];
  auVar3 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])(in_RDI + 0xc));
  uVar16 = in_RDI[0x30];
  uVar17 = in_RDI[0x31];
  uVar18 = in_RDI[0x32];
  uVar19 = in_RDI[0x33];
  uVar20 = in_RDI[0x10];
  uVar21 = in_RDI[0x11];
  uVar22 = in_RDI[0x12];
  uVar23 = in_RDI[0x13];
  auVar4 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])(in_RDI + 0x2c));
  auVar5 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])(in_RDI + 4));
  uVar24 = in_RDI[0x38];
  uVar25 = in_RDI[0x39];
  uVar26 = in_RDI[0x3a];
  uVar27 = in_RDI[0x3b];
  uVar28 = in_RDI[0x18];
  uVar29 = in_RDI[0x19];
  uVar30 = in_RDI[0x1a];
  uVar31 = in_RDI[0x1b];
  auVar6 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])(in_RDI + 0x24));
  uVar32 = in_RDI[8];
  uVar33 = in_RDI[9];
  uVar34 = in_RDI[10];
  uVar35 = in_RDI[0xb];
  auVar7 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])(in_RDI + 0x34));
  auVar8 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])(in_RDI + 0x14));
  local_6c0 = auVar8._0_8_;
  uStack_6b8 = auVar8._8_8_;
  uStack_6b0 = auVar8._16_4_;
  cos_bit_00 = auVar8._20_4_;
  uVar42 = auVar8._24_8_;
  uVar43 = in_RDI[0x28];
  uVar44 = in_RDI[0x29];
  lVar45 = in_RDI[0x2a];
  uVar36 = in_RDI[0x2b];
  w0[1] = auVar48._0_8_;
  w0[0] = auVar47._8_8_;
  w0[2] = auVar48._8_8_;
  w0[3] = lVar39;
  w1[1] = auVar46._0_8_;
  w1[0] = auVar40._8_8_;
  w1[2] = auVar46._8_8_;
  w1[3] = auVar47._0_8_;
  _r_00[1] = uVar43;
  _r_00[0] = uVar42;
  _r_00[2] = uVar44;
  _r_00[3] = lVar45;
  btf_16_w16_avx2(w0,w1,auVar40._0_8_,in1,_r_00,cos_bit_00);
  w0_00[1] = auVar48._0_8_;
  w0_00[0] = auVar47._8_8_;
  w0_00[2] = auVar48._8_8_;
  w0_00[3] = lVar39;
  w1_00[1] = auVar46._0_8_;
  w1_00[0] = auVar40._8_8_;
  w1_00[2] = auVar46._8_8_;
  w1_00[3] = auVar47._0_8_;
  _r_01[1] = uVar43;
  _r_01[0] = uVar42;
  _r_01[2] = uVar44;
  _r_01[3] = lVar45;
  btf_16_w16_avx2(w0_00,w1_00,auVar40._0_8_,in1,_r_01,cos_bit_00);
  w0_01[1] = auVar48._0_8_;
  w0_01[0] = auVar47._8_8_;
  w0_01[2] = auVar48._8_8_;
  w0_01[3] = lVar39;
  w1_01[1] = auVar46._0_8_;
  w1_01[0] = auVar40._8_8_;
  w1_01[2] = auVar46._8_8_;
  w1_01[3] = auVar47._0_8_;
  _r_02[1] = uVar43;
  _r_02[0] = uVar42;
  _r_02[2] = uVar44;
  _r_02[3] = lVar45;
  btf_16_w16_avx2(w0_01,w1_01,auVar40._0_8_,in1,_r_02,cos_bit_00);
  w0_02[1] = auVar48._0_8_;
  w0_02[0] = auVar47._8_8_;
  w0_02[2] = auVar48._8_8_;
  w0_02[3] = lVar39;
  w1_02[1] = auVar46._0_8_;
  w1_02[0] = auVar40._8_8_;
  w1_02[2] = auVar46._8_8_;
  w1_02[3] = auVar47._0_8_;
  _r_03[1] = uVar43;
  _r_03[0] = uVar42;
  _r_03[2] = uVar44;
  _r_03[3] = lVar45;
  btf_16_w16_avx2(w0_02,w1_02,auVar40._0_8_,in1,_r_03,cos_bit_00);
  in0 = auVar2._16_8_;
  in1_00 = auVar2._8_8_;
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  w0_03[1] = auVar48._0_8_;
  w0_03[0] = auVar47._8_8_;
  w0_03[2] = auVar48._8_8_;
  w0_03[3] = lVar39;
  w1_03[1] = auVar46._0_8_;
  w1_03[0] = auVar40._8_8_;
  w1_03[2] = auVar46._8_8_;
  w1_03[3] = auVar47._0_8_;
  _r_04[1] = uVar43;
  _r_04[0] = uVar42;
  _r_04[2] = uVar44;
  _r_04[3] = lVar45;
  btf_16_w16_avx2(w0_03,w1_03,auVar40._0_8_,in1,_r_04,cos_bit_00);
  w0_04[1] = auVar48._0_8_;
  w0_04[0] = auVar47._8_8_;
  w0_04[2] = auVar48._8_8_;
  w0_04[3] = lVar39;
  w1_04[1] = auVar46._0_8_;
  w1_04[0] = auVar40._8_8_;
  w1_04[2] = auVar46._8_8_;
  w1_04[3] = auVar47._0_8_;
  _r_05[1] = uVar43;
  _r_05[0] = uVar42;
  _r_05[2] = uVar44;
  _r_05[3] = lVar45;
  btf_16_w16_avx2(w0_04,w1_04,auVar40._0_8_,in1,_r_05,cos_bit_00);
  w0_05[1] = auVar48._0_8_;
  w0_05[0] = auVar47._8_8_;
  w0_05[2] = auVar48._8_8_;
  w0_05[3] = lVar39;
  w1_05[1] = auVar46._0_8_;
  w1_05[0] = auVar40._8_8_;
  w1_05[2] = auVar46._8_8_;
  w1_05[3] = auVar47._0_8_;
  _r_06[1] = uVar43;
  _r_06[0] = uVar42;
  _r_06[2] = uVar44;
  _r_06[3] = lVar45;
  btf_16_w16_avx2(w0_05,w1_05,auVar40._0_8_,in1,_r_06,cos_bit_00);
  w0_06[1] = auVar48._0_8_;
  w0_06[0] = auVar47._8_8_;
  w0_06[2] = auVar48._8_8_;
  w0_06[3] = lVar39;
  w1_06[1] = auVar46._0_8_;
  w1_06[0] = auVar40._8_8_;
  w1_06[2] = auVar46._8_8_;
  w1_06[3] = auVar47._0_8_;
  _r_07[1] = uVar43;
  _r_07[0] = uVar42;
  _r_07[2] = uVar44;
  _r_07[3] = lVar45;
  btf_16_w16_avx2(w0_06,w1_06,auVar40._0_8_,in1,_r_07,cos_bit_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  w0_07[1] = auVar48._0_8_;
  w0_07[0] = auVar47._8_8_;
  w0_07[2] = auVar48._8_8_;
  w0_07[3] = lVar39;
  w1_07[1] = auVar46._0_8_;
  w1_07[0] = auVar40._8_8_;
  w1_07[2] = auVar46._8_8_;
  w1_07[3] = auVar47._0_8_;
  _r_08[1] = uVar43;
  _r_08[0] = uVar42;
  _r_08[2] = uVar44;
  _r_08[3] = lVar45;
  btf_16_w16_avx2(w0_07,w1_07,auVar40._0_8_,in1,_r_08,cos_bit_00);
  w0_08[1] = auVar48._0_8_;
  w0_08[0] = auVar47._8_8_;
  w0_08[2] = auVar48._8_8_;
  w0_08[3] = lVar39;
  w1_08[1] = auVar46._0_8_;
  w1_08[0] = auVar40._8_8_;
  w1_08[2] = auVar46._8_8_;
  w1_08[3] = auVar47._0_8_;
  _r_09[1] = uVar43;
  _r_09[0] = uVar42;
  _r_09[2] = uVar44;
  _r_09[3] = lVar45;
  btf_16_w16_avx2(w0_08,w1_08,auVar40._0_8_,in1,_r_09,cos_bit_00);
  w0_09[1] = auVar48._0_8_;
  w0_09[0] = auVar47._8_8_;
  w0_09[2] = auVar48._8_8_;
  w0_09[3] = lVar39;
  w1_09[1] = auVar46._0_8_;
  w1_09[0] = auVar40._8_8_;
  w1_09[2] = auVar46._8_8_;
  w1_09[3] = auVar47._0_8_;
  _r_10[1] = uVar43;
  _r_10[0] = uVar42;
  _r_10[2] = uVar44;
  _r_10[3] = lVar45;
  btf_16_w16_avx2(w0_09,w1_09,auVar40._0_8_,in1,_r_10,cos_bit_00);
  w0_10[1] = auVar48._0_8_;
  w0_10[0] = auVar47._8_8_;
  w0_10[2] = auVar48._8_8_;
  w0_10[3] = lVar39;
  w1_10[1] = auVar46._0_8_;
  w1_10[0] = auVar40._8_8_;
  w1_10[2] = auVar46._8_8_;
  w1_10[3] = auVar47._0_8_;
  _r_11[1] = uVar43;
  _r_11[0] = uVar42;
  _r_11[2] = uVar44;
  _r_11[3] = lVar45;
  btf_16_w16_avx2(w0_10,w1_10,auVar40._0_8_,in1,_r_11,cos_bit_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  btf_16_adds_subs_avx2(in0,in1_00);
  w0_11[1] = auVar48._0_8_;
  w0_11[0] = auVar47._8_8_;
  w0_11[2] = auVar48._8_8_;
  w0_11[3] = lVar39;
  w1_11[1] = auVar46._0_8_;
  w1_11[0] = auVar40._8_8_;
  w1_11[2] = auVar46._8_8_;
  w1_11[3] = auVar47._0_8_;
  _r_12[1] = uVar43;
  _r_12[0] = uVar42;
  _r_12[2] = uVar44;
  _r_12[3] = lVar45;
  btf_16_w16_avx2(w0_11,w1_11,auVar40._0_8_,in1,_r_12,cos_bit_00);
  w0_12[1] = auVar48._0_8_;
  w0_12[0] = auVar47._8_8_;
  w0_12[2] = auVar48._8_8_;
  w0_12[3] = lVar39;
  w1_12[1] = auVar46._0_8_;
  w1_12[0] = auVar40._8_8_;
  w1_12[2] = auVar46._8_8_;
  w1_12[3] = auVar47._0_8_;
  _r_13[1] = uVar43;
  _r_13[0] = uVar42;
  _r_13[2] = uVar44;
  _r_13[3] = lVar45;
  btf_16_w16_avx2(w0_12,w1_12,auVar40._0_8_,in1,_r_13,cos_bit_00);
  w0_13[1] = auVar48._0_8_;
  w0_13[0] = auVar47._8_8_;
  w0_13[2] = auVar48._8_8_;
  w0_13[3] = lVar39;
  w1_13[1] = auVar46._0_8_;
  w1_13[0] = auVar40._8_8_;
  w1_13[2] = auVar46._8_8_;
  w1_13[3] = auVar47._0_8_;
  _r_14[1] = uVar43;
  _r_14[0] = uVar42;
  _r_14[2] = uVar44;
  _r_14[3] = lVar45;
  btf_16_w16_avx2(w0_13,w1_13,auVar40._0_8_,in1,_r_14,cos_bit_00);
  w0_14[1] = auVar48._0_8_;
  w0_14[0] = auVar47._8_8_;
  w0_14[2] = auVar48._8_8_;
  w0_14[3] = lVar39;
  w1_14[1] = auVar46._0_8_;
  w1_14[0] = auVar40._8_8_;
  w1_14[2] = auVar46._8_8_;
  w1_14[3] = auVar47._0_8_;
  _r_15[1] = uVar43;
  _r_15[0] = uVar42;
  _r_15[2] = uVar44;
  _r_15[3] = lVar45;
  btf_16_w16_avx2(w0_14,w1_14,auVar40._0_8_,in1,_r_15,cos_bit_00);
  w0_15[1] = auVar48._0_8_;
  w0_15[0] = auVar47._8_8_;
  w0_15[2] = auVar48._8_8_;
  w0_15[3] = lVar39;
  w1_15[1] = auVar46._0_8_;
  w1_15[0] = auVar40._8_8_;
  w1_15[2] = auVar46._8_8_;
  w1_15[3] = auVar47._0_8_;
  _r_16[1] = uVar43;
  _r_16[0] = uVar42;
  _r_16[2] = uVar44;
  _r_16[3] = lVar45;
  btf_16_w16_avx2(w0_15,w1_15,auVar40._0_8_,in1,_r_16,cos_bit_00);
  w0_16[1] = auVar48._0_8_;
  w0_16[0] = auVar47._8_8_;
  w0_16[2] = auVar48._8_8_;
  w0_16[3] = lVar39;
  w1_16[1] = auVar46._0_8_;
  w1_16[0] = auVar40._8_8_;
  w1_16[2] = auVar46._8_8_;
  w1_16[3] = auVar47._0_8_;
  _r_17[1] = uVar43;
  _r_17[0] = uVar42;
  _r_17[2] = uVar44;
  _r_17[3] = lVar45;
  btf_16_w16_avx2(w0_16,w1_16,auVar40._0_8_,in1,_r_17,cos_bit_00);
  w0_17[1] = auVar48._0_8_;
  w0_17[0] = auVar47._8_8_;
  w0_17[2] = auVar48._8_8_;
  w0_17[3] = lVar39;
  w1_17[1] = auVar46._0_8_;
  w1_17[0] = auVar40._8_8_;
  w1_17[2] = auVar46._8_8_;
  w1_17[3] = auVar47._0_8_;
  _r_18[1] = uVar43;
  _r_18[0] = uVar42;
  _r_18[2] = uVar44;
  _r_18[3] = lVar45;
  btf_16_w16_avx2(w0_17,w1_17,auVar40._0_8_,in1,_r_18,cos_bit_00);
  w0_18[1] = auVar48._0_8_;
  w0_18[0] = auVar47._8_8_;
  w0_18[2] = auVar48._8_8_;
  w0_18[3] = lVar39;
  w1_18[1] = auVar46._0_8_;
  w1_18[0] = auVar40._8_8_;
  w1_18[2] = auVar46._8_8_;
  w1_18[3] = auVar47._0_8_;
  _r_19[1] = uVar43;
  _r_19[0] = uVar42;
  _r_19[2] = uVar44;
  _r_19[3] = lVar45;
  btf_16_w16_avx2(w0_18,w1_18,auVar40._0_8_,in1,_r_19,cos_bit_00);
  local_860 = auVar1._0_8_;
  uStack_858 = auVar1._8_8_;
  uStack_850 = auVar1._16_8_;
  uStack_848 = auVar1._24_8_;
  *in_RSI = local_860;
  in_RSI[1] = uStack_858;
  in_RSI[2] = uStack_850;
  in_RSI[3] = uStack_848;
  in_RSI[4] = local_6c0;
  in_RSI[5] = uStack_6b8;
  in_RSI[6] = CONCAT44(cos_bit_00,uStack_6b0);
  in_RSI[7] = uVar42;
  in_RSI[8] = uVar12;
  in_RSI[9] = uVar13;
  in_RSI[10] = uVar14;
  in_RSI[0xb] = uVar15;
  in_RSI[0xc] = uVar32;
  in_RSI[0xd] = uVar33;
  in_RSI[0xe] = uVar34;
  in_RSI[0xf] = uVar35;
  in_RSI[0x10] = uVar16;
  in_RSI[0x11] = uVar17;
  in_RSI[0x12] = uVar18;
  in_RSI[0x13] = uVar19;
  in_RSI[0x14] = uVar28;
  in_RSI[0x15] = uVar29;
  in_RSI[0x16] = uVar30;
  in_RSI[0x17] = uVar31;
  local_7a0 = auVar4._0_8_;
  uStack_798 = auVar4._8_8_;
  uStack_790 = auVar4._16_8_;
  uStack_788 = auVar4._24_8_;
  in_RSI[0x18] = local_7a0;
  in_RSI[0x19] = uStack_798;
  in_RSI[0x1a] = uStack_790;
  in_RSI[0x1b] = uStack_788;
  local_780 = auVar5._0_8_;
  uStack_778 = auVar5._8_8_;
  uStack_770 = auVar5._16_8_;
  uStack_768 = auVar5._24_8_;
  in_RSI[0x1c] = local_780;
  in_RSI[0x1d] = uStack_778;
  in_RSI[0x1e] = uStack_770;
  in_RSI[0x1f] = uStack_768;
  in_RSI[0x20] = uVar24;
  in_RSI[0x21] = uVar25;
  in_RSI[0x22] = uVar26;
  in_RSI[0x23] = uVar27;
  in_RSI[0x24] = uVar20;
  in_RSI[0x25] = uVar21;
  in_RSI[0x26] = uVar22;
  in_RSI[0x27] = uVar23;
  local_720 = auVar6._0_8_;
  uStack_718 = auVar6._8_8_;
  uStack_710 = auVar6._16_8_;
  uStack_708 = auVar6._24_8_;
  in_RSI[0x28] = local_720;
  in_RSI[0x29] = uStack_718;
  in_RSI[0x2a] = uStack_710;
  in_RSI[0x2b] = uStack_708;
  local_800 = auVar3._0_8_;
  uStack_7f8 = auVar3._8_8_;
  uStack_7f0 = auVar3._16_8_;
  uStack_7e8 = auVar3._24_8_;
  in_RSI[0x2c] = local_800;
  in_RSI[0x2d] = uStack_7f8;
  in_RSI[0x2e] = uStack_7f0;
  in_RSI[0x2f] = uStack_7e8;
  local_6e0 = auVar7._0_8_;
  uStack_6d8 = auVar7._8_8_;
  uStack_6d0 = auVar7._16_8_;
  uStack_6c8 = auVar7._24_8_;
  in_RSI[0x30] = local_6e0;
  in_RSI[0x31] = uStack_6d8;
  in_RSI[0x32] = uStack_6d0;
  in_RSI[0x33] = uStack_6c8;
  local_840 = auVar2._0_8_;
  uStack_828 = auVar2._24_8_;
  in_RSI[0x34] = local_840;
  in_RSI[0x35] = in1_00;
  in_RSI[0x36] = in0;
  in_RSI[0x37] = uStack_828;
  in_RSI[0x38] = uVar43;
  in_RSI[0x39] = uVar44;
  in_RSI[0x3a] = lVar45;
  in_RSI[0x3b] = uVar36;
  in_RSI[0x3c] = uVar9;
  in_RSI[0x3d] = uVar10;
  in_RSI[0x3e] = uVar41;
  in_RSI[0x3f] = uVar11;
  return;
}

Assistant:

static inline void fadst16x16_new_avx2(const __m256i *input, __m256i *output,
                                       int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i __zero = _mm256_setzero_si256();
  const __m256i _r = _mm256_set1_epi32(1 << (cos_bit - 1));

  __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  __m256i cospi_p16_p48 = pair_set_w16_epi16(cospi[16], cospi[48]);
  __m256i cospi_p48_m16 = pair_set_w16_epi16(cospi[48], -cospi[16]);
  __m256i cospi_m48_p16 = pair_set_w16_epi16(-cospi[48], cospi[16]);
  __m256i cospi_p08_p56 = pair_set_w16_epi16(cospi[8], cospi[56]);
  __m256i cospi_p56_m08 = pair_set_w16_epi16(cospi[56], -cospi[8]);
  __m256i cospi_p40_p24 = pair_set_w16_epi16(cospi[40], cospi[24]);
  __m256i cospi_p24_m40 = pair_set_w16_epi16(cospi[24], -cospi[40]);
  __m256i cospi_m56_p08 = pair_set_w16_epi16(-cospi[56], cospi[8]);
  __m256i cospi_m24_p40 = pair_set_w16_epi16(-cospi[24], cospi[40]);
  __m256i cospi_p02_p62 = pair_set_w16_epi16(cospi[2], cospi[62]);
  __m256i cospi_p62_m02 = pair_set_w16_epi16(cospi[62], -cospi[2]);
  __m256i cospi_p10_p54 = pair_set_w16_epi16(cospi[10], cospi[54]);
  __m256i cospi_p54_m10 = pair_set_w16_epi16(cospi[54], -cospi[10]);
  __m256i cospi_p18_p46 = pair_set_w16_epi16(cospi[18], cospi[46]);
  __m256i cospi_p46_m18 = pair_set_w16_epi16(cospi[46], -cospi[18]);
  __m256i cospi_p26_p38 = pair_set_w16_epi16(cospi[26], cospi[38]);
  __m256i cospi_p38_m26 = pair_set_w16_epi16(cospi[38], -cospi[26]);
  __m256i cospi_p34_p30 = pair_set_w16_epi16(cospi[34], cospi[30]);
  __m256i cospi_p30_m34 = pair_set_w16_epi16(cospi[30], -cospi[34]);
  __m256i cospi_p42_p22 = pair_set_w16_epi16(cospi[42], cospi[22]);
  __m256i cospi_p22_m42 = pair_set_w16_epi16(cospi[22], -cospi[42]);
  __m256i cospi_p50_p14 = pair_set_w16_epi16(cospi[50], cospi[14]);
  __m256i cospi_p14_m50 = pair_set_w16_epi16(cospi[14], -cospi[50]);
  __m256i cospi_p58_p06 = pair_set_w16_epi16(cospi[58], cospi[6]);
  __m256i cospi_p06_m58 = pair_set_w16_epi16(cospi[6], -cospi[58]);

  // stage 1
  __m256i x1[16];
  x1[0] = input[0];
  x1[1] = _mm256_subs_epi16(__zero, input[15]);
  x1[2] = _mm256_subs_epi16(__zero, input[7]);
  x1[3] = input[8];
  x1[4] = _mm256_subs_epi16(__zero, input[3]);
  x1[5] = input[12];
  x1[6] = input[4];
  x1[7] = _mm256_subs_epi16(__zero, input[11]);
  x1[8] = _mm256_subs_epi16(__zero, input[1]);
  x1[9] = input[14];
  x1[10] = input[6];
  x1[11] = _mm256_subs_epi16(__zero, input[9]);
  x1[12] = input[2];
  x1[13] = _mm256_subs_epi16(__zero, input[13]);
  x1[14] = _mm256_subs_epi16(__zero, input[5]);
  x1[15] = input[10];

  // stage 2
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[2], &x1[3], _r, cos_bit);
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[6], &x1[7], _r, cos_bit);
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[10], &x1[11], _r, cos_bit);
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[14], &x1[15], _r, cos_bit);

  // stage 3
  btf_16_adds_subs_avx2(&x1[0], &x1[2]);
  btf_16_adds_subs_avx2(&x1[1], &x1[3]);
  btf_16_adds_subs_avx2(&x1[4], &x1[6]);
  btf_16_adds_subs_avx2(&x1[5], &x1[7]);
  btf_16_adds_subs_avx2(&x1[8], &x1[10]);
  btf_16_adds_subs_avx2(&x1[9], &x1[11]);
  btf_16_adds_subs_avx2(&x1[12], &x1[14]);
  btf_16_adds_subs_avx2(&x1[13], &x1[15]);

  // stage 4
  btf_16_w16_avx2(cospi_p16_p48, cospi_p48_m16, &x1[4], &x1[5], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_p16, cospi_p16_p48, &x1[6], &x1[7], _r, cos_bit);
  btf_16_w16_avx2(cospi_p16_p48, cospi_p48_m16, &x1[12], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_p16, cospi_p16_p48, &x1[14], &x1[15], _r, cos_bit);

  // stage 5
  btf_16_adds_subs_avx2(&x1[0], &x1[4]);
  btf_16_adds_subs_avx2(&x1[1], &x1[5]);
  btf_16_adds_subs_avx2(&x1[2], &x1[6]);
  btf_16_adds_subs_avx2(&x1[3], &x1[7]);
  btf_16_adds_subs_avx2(&x1[8], &x1[12]);
  btf_16_adds_subs_avx2(&x1[9], &x1[13]);
  btf_16_adds_subs_avx2(&x1[10], &x1[14]);
  btf_16_adds_subs_avx2(&x1[11], &x1[15]);

  // stage 6
  btf_16_w16_avx2(cospi_p08_p56, cospi_p56_m08, &x1[8], &x1[9], _r, cos_bit);
  btf_16_w16_avx2(cospi_p40_p24, cospi_p24_m40, &x1[10], &x1[11], _r, cos_bit);
  btf_16_w16_avx2(cospi_m56_p08, cospi_p08_p56, &x1[12], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_m24_p40, cospi_p40_p24, &x1[14], &x1[15], _r, cos_bit);

  // stage 7
  btf_16_adds_subs_avx2(&x1[0], &x1[8]);
  btf_16_adds_subs_avx2(&x1[1], &x1[9]);
  btf_16_adds_subs_avx2(&x1[2], &x1[10]);
  btf_16_adds_subs_avx2(&x1[3], &x1[11]);
  btf_16_adds_subs_avx2(&x1[4], &x1[12]);
  btf_16_adds_subs_avx2(&x1[5], &x1[13]);
  btf_16_adds_subs_avx2(&x1[6], &x1[14]);
  btf_16_adds_subs_avx2(&x1[7], &x1[15]);

  // stage 8
  btf_16_w16_avx2(cospi_p02_p62, cospi_p62_m02, &x1[0], &x1[1], _r, cos_bit);
  btf_16_w16_avx2(cospi_p10_p54, cospi_p54_m10, &x1[2], &x1[3], _r, cos_bit);
  btf_16_w16_avx2(cospi_p18_p46, cospi_p46_m18, &x1[4], &x1[5], _r, cos_bit);
  btf_16_w16_avx2(cospi_p26_p38, cospi_p38_m26, &x1[6], &x1[7], _r, cos_bit);
  btf_16_w16_avx2(cospi_p34_p30, cospi_p30_m34, &x1[8], &x1[9], _r, cos_bit);
  btf_16_w16_avx2(cospi_p42_p22, cospi_p22_m42, &x1[10], &x1[11], _r, cos_bit);
  btf_16_w16_avx2(cospi_p50_p14, cospi_p14_m50, &x1[12], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_p58_p06, cospi_p06_m58, &x1[14], &x1[15], _r, cos_bit);

  // stage 9
  output[0] = x1[1];
  output[1] = x1[14];
  output[2] = x1[3];
  output[3] = x1[12];
  output[4] = x1[5];
  output[5] = x1[10];
  output[6] = x1[7];
  output[7] = x1[8];
  output[8] = x1[9];
  output[9] = x1[6];
  output[10] = x1[11];
  output[11] = x1[4];
  output[12] = x1[13];
  output[13] = x1[2];
  output[14] = x1[15];
  output[15] = x1[0];
}